

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

int Socket(void)

{
  int __fd;
  int iVar1;
  char *__s;
  sockaddr_in address;
  
  __fd = socket(2,1,0);
  if (__fd == 0) {
    __s = "In socket";
  }
  else {
    address.sin_family = 2;
    address.sin_addr.s_addr = 0;
    address.sin_port = (ushort)SERVER_PORT << 8 | (ushort)SERVER_PORT >> 8;
    address.sin_zero[0] = '\0';
    address.sin_zero[1] = '\0';
    address.sin_zero[2] = '\0';
    address.sin_zero[3] = '\0';
    address.sin_zero[4] = '\0';
    address.sin_zero[5] = '\0';
    address.sin_zero[6] = '\0';
    address.sin_zero[7] = '\0';
    iVar1 = bind(__fd,(sockaddr *)&address,0x10);
    if (iVar1 < 0) {
      __s = "In bind";
    }
    else {
      iVar1 = listen(__fd,10);
      if (-1 < iVar1) {
        return __fd;
      }
      __s = "In listen";
    }
  }
  perror(__s);
  exit(1);
}

Assistant:

int Socket() {

    struct sockaddr_in address;
    int server_fd;

    if ((server_fd = socket(AF_INET, SOCK_STREAM, 0)) == 0) {
        perror("In socket");
        exit(EXIT_FAILURE);
    }

    address.sin_family = AF_INET;
    address.sin_addr.s_addr = INADDR_ANY;
    address.sin_port = htons(SERVER_PORT);

    memset(address.sin_zero, '\0', sizeof address.sin_zero);


    if (bind(server_fd, (struct sockaddr *) &address, sizeof(address)) < 0) {
        perror("In bind");
        exit(EXIT_FAILURE);
    }

    if (listen(server_fd, 10) < 0) {
        perror("In listen");
        exit(EXIT_FAILURE);
    }

    return server_fd;
}